

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
booster::locale::ios_info::string_set::get<char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string_set *this)

{
  char *__s1;
  int iVar1;
  undefined8 *puVar2;
  allocator local_11;
  
  if (this->type != (type_info *)0x0) {
    __s1 = *(char **)(this->type + 8);
    if (__s1 == _showmanyc) {
LAB_00185324:
      std::__cxx11::string::string((string *)__return_storage_ptr__,this->ptr,&local_11);
      return __return_storage_ptr__;
    }
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,_showmanyc);
      if (iVar1 == 0) goto LAB_00185324;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &std::__cxx11::moneypunct<char,true>::id;
  __cxa_throw(puVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::basic_string<Char> get() const
                {
                    if(type==0 || *type!=typeid(Char))
                        throw std::bad_cast();
                    std::basic_string<Char> result = reinterpret_cast<Char const *>(ptr);
                    return result;
                }